

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::detail::unit_data::empty(unit_data *this)

{
  undefined1 local_11;
  unit_data *this_local;
  
  local_11 = false;
  if ((((((((int)*this << 0x1c) >> 0x1c == 0) &&
         (local_11 = false, ((int)*this << 0x18) >> 0x1c == 0)) &&
        (local_11 = false, ((int)*this << 0x15) >> 0x1d == 0)) &&
       ((local_11 = false, ((int)*this << 0x12) >> 0x1d == 0 &&
        (local_11 = false, ((int)*this << 0x10) >> 0x1e == 0)))) &&
      ((local_11 = false, ((int)*this << 0xd) >> 0x1d == 0 &&
       ((local_11 = false, ((int)*this << 0xb) >> 0x1e == 0 &&
        (local_11 = false, ((int)*this << 8) >> 0x1d == 0)))))) &&
     ((local_11 = false, ((int)*this << 6) >> 0x1e == 0 &&
      (local_11 = false, ((int)*this << 4) >> 0x1e == 0)))) {
    local_11 = -1 < (int)*this;
  }
  return local_11;
}

Assistant:

constexpr bool empty() const
        {
            return meter_ == 0 && second_ == 0 && kilogram_ == 0 &&
                ampere_ == 0 && candela_ == 0 && kelvin_ == 0 && mole_ == 0 &&
                radians_ == 0 && currency_ == 0 && count_ == 0 &&
                equation_ == 0U;
        }